

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

void cmQtAutoGen::RccListParseContent
               (string *content,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  bool bVar1;
  pointer string;
  string qrcEntry;
  string tag;
  RegularExpression fileReplaceRegex;
  RegularExpression fileMatchRegex;
  char *local_230;
  long local_228;
  char local_220;
  undefined7 uStack_21f;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"(<file[^<]+)");
  local_1d0.regmatch.startp[0] = (char *)0x0;
  local_1d0.regmatch.endp[0] = (char *)0x0;
  local_1d0.regmatch.searchstring = (char *)0x0;
  local_1d0.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_1d0,"(^<file[^>]*>)");
  string = (content->_M_dataplus)._M_p;
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&local_100,string,&local_100.regmatch);
    if (!bVar1) break;
    if (local_100.regmatch.startp[1] == (char *)0x0) {
      local_230 = &local_220;
      local_228 = 0;
      local_220 = '\0';
    }
    else {
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,local_100.regmatch.startp[1],local_100.regmatch.endp[1]);
    }
    string = string + local_228;
    cmsys::RegularExpression::find(&local_1d0,local_230,&local_1d0.regmatch);
    local_210 = &local_200;
    if (local_1d0.regmatch.startp[1] == (char *)0x0) {
      local_208 = 0;
      local_200 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,local_1d0.regmatch.startp[1],local_1d0.regmatch.endp[1]);
    }
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&local_230);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_1f0
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
    }
  }
  if (local_1d0.program != (char *)0x0) {
    operator_delete__(local_1d0.program);
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return;
}

Assistant:

void cmQtAutoGen::RccListParseContent(std::string const& content,
                                      std::vector<std::string>& files)
{
  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");
  cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");

  const char* contentChars = content.c_str();
  while (fileMatchRegex.find(contentChars)) {
    std::string const qrcEntry = fileMatchRegex.match(1);
    contentChars += qrcEntry.size();
    {
      fileReplaceRegex.find(qrcEntry);
      std::string const tag = fileReplaceRegex.match(1);
      files.push_back(qrcEntry.substr(tag.size()));
    }
  }
}